

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall
r_comp::Decompiler::write_expression_tail
          (Decompiler *this,uint16_t read_index,bool apply_time_offset,bool vertical)

{
  byte bVar1;
  char local_1c [2];
  ushort local_1a;
  bool local_17;
  ushort local_16;
  byte local_14;
  byte local_13;
  uint16_t i;
  bool after_tail_wildcard;
  uint16_t arity;
  bool vertical_local;
  bool apply_time_offset_local;
  Decompiler *pDStack_10;
  uint16_t read_index_local;
  Decompiler *this_local;
  
  local_14 = vertical;
  local_13 = apply_time_offset;
  i = read_index;
  pDStack_10 = this;
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)read_index);
  bVar1 = r_code::Atom::getAtomCount();
  local_16 = (ushort)bVar1;
  local_17 = false;
  for (local_1a = 0; local_1a < local_16; local_1a = local_1a + 1) {
    if ((local_17 & 1U) == 0) {
      if ((this->closing_set & 1U) == 0) {
        if ((local_14 & 1) == 0) {
          local_1c[0] = ' ';
          OutStream::operator<<(this->out_stream,local_1c);
        }
      }
      else {
        this->closing_set = false;
        if ((this->horizontal_set & 1U) == 0) {
          write_indent(this,this->indents);
        }
        else {
          local_1c[1] = 0x20;
          OutStream::operator<<(this->out_stream,local_1c + 1);
        }
      }
      i = i + 1;
      write_any(this,i,&local_17,(bool)(local_13 & 1),0);
      if (((this->closing_set & 1U) == 0) && ((local_14 & 1) != 0)) {
        OutStream::operator<<(this->out_stream,(char (*) [2])0x1ca3d6);
      }
    }
    else {
      i = i + 1;
      write_any(this,i,&local_17,(bool)(local_13 & 1),0);
    }
  }
  return;
}

Assistant:

void Decompiler::write_expression_tail(uint16_t read_index, bool apply_time_offset, bool vertical)   // read_index points initially to the head.
{
    uint16_t arity = current_object->code[read_index].getAtomCount();
    bool after_tail_wildcard = false;

    for (uint16_t i = 0; i < arity; ++i) {
        if (after_tail_wildcard) {
            write_any(++read_index, after_tail_wildcard, apply_time_offset);
        } else {
            if (closing_set) {
                closing_set = false;

                if (!horizontal_set) {
                    write_indent(indents);
                } else {
                    *out_stream << ' ';
                }
            } else if (!vertical) {
                *out_stream << ' ';
            }

            write_any(++read_index, after_tail_wildcard, apply_time_offset);

            if (!closing_set && vertical) {
                *out_stream << "\n";
            }
        }
    }
}